

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O1

uint32_t ixgbe_tx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  long *plVar1;
  ushort uVar2;
  pkt_buf *ppVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  undefined6 in_register_00000032;
  long lVar11;
  ushort uVar12;
  uint uVar13;
  
  uVar8 = (ulong)(uint)((int)CONCAT62(in_register_00000032,queue_id) << 4);
  plVar1 = (long *)(*(long *)&ixy[1].num_rx_queues + uVar8);
  uVar9 = (uint)*(ushort *)(*(long *)&ixy[1].num_rx_queues + 10 + uVar8);
  do {
    uVar6 = uVar9 & 0xffff;
    iVar10 = *(ushort *)((long)plVar1 + 0xc) - uVar6;
    if (iVar10 < 0) {
      iVar10 = iVar10 + (uint)*(ushort *)(plVar1 + 1);
    }
    bVar5 = false;
    if (0x1f < iVar10) {
      uVar13 = (uint)*(ushort *)(plVar1 + 1);
      if (uVar6 + 0x1f < (uint)*(ushort *)(plVar1 + 1)) {
        uVar13 = 0;
      }
      uVar13 = (uVar6 + 0x1f) - uVar13;
      if ((*(uint *)(*plVar1 + 0xc + (long)(int)uVar13 * 0x10) & 1) != 0) {
        for (; pkt_buf_free((pkt_buf *)plVar1[(ulong)uVar6 + 2]), uVar6 != uVar13;
            uVar6 = (int)plVar1[1] - 1U & uVar6 + 1 & 0xffff) {
        }
        uVar9 = (int)plVar1[1] - 1U & uVar13 + 1;
        bVar5 = true;
      }
    }
  } while (bVar5);
  *(ushort *)((long)plVar1 + 10) = (ushort)uVar9;
  uVar7 = 0;
  uVar8 = uVar7;
  if (num_bufs != 0) {
    do {
      uVar2 = *(ushort *)((long)plVar1 + 0xc);
      uVar12 = (short)(int)plVar1[1] - 1U & uVar2 + 1;
      uVar8 = uVar7;
      if ((ushort)uVar9 == uVar12) break;
      ppVar3 = bufs[uVar7];
      plVar1[(ulong)uVar2 + 2] = (long)ppVar3;
      lVar4 = *plVar1;
      lVar11 = (ulong)uVar2 * 0x10;
      *(ushort *)((long)plVar1 + 0xc) = uVar12;
      *(uintptr_t *)(lVar4 + lVar11) = ppVar3->buf_addr_phy + 0x40;
      *(uint32_t *)(lVar4 + 8 + lVar11) = ppVar3->size | 0x2b300000;
      *(uint32_t *)(lVar4 + 0xc + lVar11) = ppVar3->size << 0xe;
      uVar7 = uVar7 + 1;
      uVar8 = (ulong)num_bufs;
    } while (num_bufs != uVar7);
  }
  *(uint *)(ixy[1].pci_addr + (ulong)queue_id * 0x40 + 0x6018) =
       (uint)*(ushort *)((long)plVar1 + 0xc);
  return (uint32_t)uVar8;
}

Assistant:

uint32_t ixgbe_tx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);
	struct ixgbe_tx_queue* queue = ((struct ixgbe_tx_queue*)(dev->tx_queues)) + queue_id;
	// the descriptor is explained in section 7.2.3.2.4
	// we just use a struct copy & pasted from intel, but it basically has two formats (hence a union):
	// 1. the write-back format which is written by the NIC once sending it is finished this is used in step 1
	// 2. the read format which is read by the NIC and written by us, this is used in step 2

	uint16_t clean_index = queue->clean_index; // next descriptor to clean up

	// step 1: clean up descriptors that were sent out by the hardware and return them to the mempool
	// start by reading step 2 which is done first for each packet
	// cleaning up must be done in batches for performance reasons, so this is unfortunately somewhat complicated
	while (true) {
		// figure out how many descriptors can be cleaned up
		int32_t cleanable = queue->tx_index - clean_index; // tx_index is always ahead of clean (invariant of our queue)
		if (cleanable < 0) { // handle wrap-around
			cleanable = queue->num_entries + cleanable;
		}
		if (cleanable < TX_CLEAN_BATCH) {
			break;
		}
		// calculcate the index of the last transcriptor in the clean batch
		// we can't check all descriptors for performance reasons
		int32_t cleanup_to = clean_index + TX_CLEAN_BATCH - 1;
		if (cleanup_to >= queue->num_entries) {
			cleanup_to -= queue->num_entries;
		}
		volatile union ixgbe_adv_tx_desc* txd = queue->descriptors + cleanup_to;
		uint32_t status = txd->wb.status;
		// hardware sets this flag as soon as it's sent out, we can give back all bufs in the batch back to the mempool
		if (status & IXGBE_ADVTXD_STAT_DD) {
			int32_t i = clean_index;
			while (true) {
				struct pkt_buf* buf = queue->virtual_addresses[i];
				pkt_buf_free(buf);
				if (i == cleanup_to) {
					break;
				}
				i = wrap_ring(i, queue->num_entries);
			}
			// next descriptor to be cleaned up is one after the one we just cleaned
			clean_index = wrap_ring(cleanup_to, queue->num_entries);
		} else {
			// clean the whole batch or nothing; yes, this leaves some packets in
			// the queue forever if you stop transmitting, but that's not a real concern
			break;
		}
	}
	queue->clean_index = clean_index;

	// step 2: send out as many of our packets as possible
	uint32_t sent;
	for (sent = 0; sent < num_bufs; sent++) {
		uint32_t next_index = wrap_ring(queue->tx_index, queue->num_entries);
		// we are full if the next index is the one we are trying to reclaim
		if (clean_index == next_index) {
			break;
		}
		struct pkt_buf* buf = bufs[sent];
		// remember virtual address to clean it up later
		queue->virtual_addresses[queue->tx_index] = (void*) buf;
		volatile union ixgbe_adv_tx_desc* txd = queue->descriptors + queue->tx_index;
		queue->tx_index = next_index;
		// NIC reads from here
		txd->read.buffer_addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data);
		// always the same flags: one buffer (EOP), advanced data descriptor, CRC offload, data length
		txd->read.cmd_type_len =
			IXGBE_ADVTXD_DCMD_EOP | IXGBE_ADVTXD_DCMD_RS | IXGBE_ADVTXD_DCMD_IFCS | IXGBE_ADVTXD_DCMD_DEXT | IXGBE_ADVTXD_DTYP_DATA | buf->size;
		// no fancy offloading stuff - only the total payload length
		// implement offloading flags here:
		// 	* ip checksum offloading is trivial: just set the offset
		// 	* tcp/udp checksum offloading is more annoying, you have to precalculate the pseudo-header checksum
		txd->read.olinfo_status = buf->size << IXGBE_ADVTXD_PAYLEN_SHIFT;
	}
	// send out by advancing tail, i.e., pass control of the bufs to the nic
	// this seems like a textbook case for a release memory order, but Intel's driver doesn't even use a compiler barrier here
	set_reg32(dev->addr, IXGBE_TDT(queue_id), queue->tx_index);
	return sent;
}